

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageIntegrationTests.cpp
# Opt level: O2

int testStorageIntegrationTestsReadDataWithIncorrectType(void)

{
  string *psVar1;
  uint64_t offset;
  ostream *poVar2;
  pointer ptVar3;
  initializer_list<unsigned_char> __l;
  Span<const_unsigned_char,_18446744073709551615UL> data_00;
  StorageReader reader;
  allocator_type local_79;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string local_60;
  AutoDeleteTempFile tempfile;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(&tempfile);
  reader.m_impl._M_t.
  super___uniq_ptr_impl<MILBlob::Blob::StorageReader::Impl,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_MILBlob::Blob::StorageReader::Impl_*,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
  .super__Head_base<0UL,_MILBlob::Blob::StorageReader::Impl_*,_false>._M_head_impl._0_4_ = 0x400002;
  reader.m_impl._M_t.
  super___uniq_ptr_impl<MILBlob::Blob::StorageReader::Impl,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_MILBlob::Blob::StorageReader::Impl_*,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
  .super__Head_base<0UL,_MILBlob::Blob::StorageReader::Impl_*,_false>._M_head_impl._4_1_ = 7;
  __l._M_len = 5;
  __l._M_array = (iterator)&reader;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&data,__l,&local_79);
  psVar1 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
  MILBlob::Blob::StorageWriter::StorageWriter((StorageWriter *)&reader,psVar1,true);
  data_00.m_size.m_size =
       (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  ptVar3 = (pointer)0x0;
  if (data_00.m_size.m_size != 0) {
    ptVar3 = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  data_00.m_ptr = ptVar3;
  offset = MILBlob::Blob::StorageWriter::WriteData<unsigned_char>((StorageWriter *)&reader,data_00);
  MILBlob::Blob::StorageWriter::~StorageWriter((StorageWriter *)&reader);
  psVar1 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
  std::__cxx11::string::string((string *)&local_60,(string *)psVar1);
  MILBlob::Blob::StorageReader::StorageReader(&reader,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  MILBlob::Blob::StorageReader::GetDataView<float>(&reader,offset);
  poVar2 = std::operator<<((ostream *)&std::clog,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageIntegrationTests.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x54);
  std::operator<<(poVar2,": expected exception, but none thrown.\n");
  MILBlob::Blob::StorageReader::~StorageReader(&reader);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&tempfile);
  return 1;
}

Assistant:

int testStorageIntegrationTestsReadDataWithIncorrectType()
{
    AutoDeleteTempFile tempfile;

    const std::vector<uint8_t> data = {0x02, 0x00, 0x40, 0x00, 0x07};
    uint64_t offset;
    {
        StorageWriter writer(tempfile.GetFilename());
        offset = writer.WriteData(Util::MakeSpan(data));
    }

    StorageReader reader(tempfile.GetFilename());
    {
        ML_ASSERT_THROWS_WITH_MESSAGE(reader.GetDataView<float>(offset),
                                      std::runtime_error,
                                      "Metadata data type does not match requested type.");
    }

    return 0;
}